

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O2

void __thiscall MetricsDiscovery::MDHelper::~MDHelper(MDHelper *this)

{
  IAdapterLatest *pIVar1;
  IAdapterGroupLatest *pIVar2;
  
  if (this->m_Activated == true) {
    DeactivateMetricSet(this);
  }
  pIVar2 = this->m_AdapterGroup;
  if (pIVar2 == (IAdapterGroupLatest *)0x0) {
    if ((this->CloseMetricsDevice != (CloseMetricsDevice_fn)0x0) &&
       (this->m_MetricsDevice != (IMetricsDeviceLatest *)0x0)) {
      (*this->CloseMetricsDevice)(this->m_MetricsDevice);
      this->m_MetricsDevice = (IMetricsDeviceLatest *)0x0;
    }
  }
  else {
    pIVar1 = this->m_Adapter;
    if ((pIVar1 != (IAdapterLatest *)0x0) && (this->m_MetricsDevice != (IMetricsDeviceLatest *)0x0))
    {
      (**(code **)(*(long *)pIVar1 + 0x30))(pIVar1);
      this->m_MetricsDevice = (IMetricsDeviceLatest *)0x0;
      pIVar2 = this->m_AdapterGroup;
    }
    (**(code **)(*(long *)pIVar2 + 0x20))();
    this->m_AdapterGroup = (IAdapterGroupLatest *)0x0;
    this->m_Adapter = (IAdapterLatest *)0x0;
  }
  this->m_Initialized = false;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_SavedReportData).super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

MDHelper::~MDHelper()
{
    if( m_Activated )
    {
        DeactivateMetricSet();
    }

    if( m_AdapterGroup != NULL )
    {
        if( m_Adapter && m_MetricsDevice )
        {
            m_Adapter->CloseMetricsDevice( m_MetricsDevice );
            m_MetricsDevice = NULL;
        }

        m_AdapterGroup->Close();
        m_AdapterGroup = NULL;
        m_Adapter = NULL;
    }
    else if( CloseMetricsDevice != NULL && m_MetricsDevice )
    {
        CloseMetricsDevice( m_MetricsDevice );
        m_MetricsDevice = NULL;
    }

    m_Initialized = false;
}